

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iomapper.cpp
# Opt level: O0

void __thiscall
glslang::TSymbolValidater::TSymbolValidater
          (TSymbolValidater *this,TIoMapResolver *r,TInfoSink *i,TVarLiveMap **in,TVarLiveMap **out,
          TVarLiveMap **uniform,bool *hadError,EProfile profile,int version)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
  *this_00;
  TInfoSink *pTVar1;
  undefined8 uVar2;
  longlong lVar3;
  bool bVar4;
  int iVar5;
  reference ppVar6;
  void *__src;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *pbVar7;
  TType *pTVar8;
  TString *name;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_01;
  size_type sVar9;
  const_reference pvVar10;
  undefined4 extraout_var;
  char *pcVar11;
  long *plVar12;
  mapped_type *pmVar13;
  undefined1 local_328 [8];
  TString err_2;
  _Self local_2f8;
  undefined1 local_2f0 [8];
  TString memberName;
  size_t memberIdx;
  TTypeList *blockType;
  string local_2b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  TString err_1;
  pool_allocator<char> local_240;
  string local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  undefined1 local_1f8 [8];
  TString err;
  bool local_1a5;
  int local_1a4;
  bool diffLocation;
  int overlapLocation;
  TRange locationRange;
  int size;
  int uniformLocation;
  TString symbolName;
  TQualifier qualifier;
  TIntermSymbol *pSymbol;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
  uniformVar;
  iterator __end4;
  iterator __begin4;
  TVarLiveMap *__range4;
  undefined1 local_98 [4];
  int i_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  usedUniformName;
  vector<glslang::TRange,_std::allocator<glslang::TRange>_> usedUniformLocation;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  anonymousMemberMap;
  TVarLiveMap **uniform_local;
  TVarLiveMap **out_local;
  TVarLiveMap **in_local;
  TInfoSink *i_local;
  TIoMapResolver *r_local;
  TSymbolValidater *this_local;
  
  this->resolver = r;
  this->infoSink = i;
  this->hadError = hadError;
  this->profile = profile;
  this->version = version;
  memcpy(this,in,0x70);
  memcpy(this->outVarMaps,out,0x70);
  memcpy(this->uniformVarMap,uniform,0x70);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
         *)&usedUniformLocation.
            super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage);
  std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::vector
            ((vector<glslang::TRange,_std::allocator<glslang::TRange>_> *)
             &usedUniformName.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            *)local_98);
  std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::clear
            ((vector<glslang::TRange,_std::allocator<glslang::TRange>_> *)
             &usedUniformName.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
           *)local_98);
  __range4._4_4_ = 0;
  do {
    if (0xd < __range4._4_4_) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                 *)local_98);
      std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::~vector
                ((vector<glslang::TRange,_std::allocator<glslang::TRange>_> *)
                 &usedUniformName.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
      ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
              *)&usedUniformLocation.
                 super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage);
      return;
    }
    if (this->uniformVarMap[__range4._4_4_] != (TVarLiveMap *)0x0) {
      this_00 = this->uniformVarMap[__range4._4_4_];
      __end4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
               ::begin(this_00);
      uniformVar.second._40_8_ =
           std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>_>
           ::end(this_00);
      while (bVar4 = std::operator!=(&__end4,(_Self *)&uniformVar.second.newIndex), bVar4) {
        ppVar6 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
                 ::operator*(&__end4);
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                *)&pSymbol,ppVar6);
        lVar3 = uniformVar.second.id;
        __src = (void *)(**(code **)(*(long *)uniformVar.second.id + 0x108))();
        memcpy((void *)((long)&symbolName.field_2 + 8),__src,0x50);
        pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 (**(code **)(*(long *)lVar3 + 0x1a0))();
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                     &size,pbVar7);
        locationRange.last = qualifier.layoutOffset & 0xfff;
        if (locationRange.last == 0xfff) {
LAB_00712472:
          iVar5 = (**(code **)(*(long *)uniformVar.second.id + 0x100))();
          if (iVar5 == 0x10) {
            name = (TString *)(**(code **)(*(long *)uniformVar.second.id + 400))();
            bVar4 = IsAnonymous(name);
            if (bVar4) {
              pTVar8 = (TType *)(**(code **)(*(long *)uniformVar.second.id + 0xf0))();
              this_01 = &TType::getStruct(pTVar8)->
                         super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
              ;
              for (memberName.field_2._8_8_ = 0; uVar2 = memberName.field_2._8_8_,
                  sVar9 = std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          size(this_01), (ulong)uVar2 < sVar9;
                  memberName.field_2._8_8_ = memberName.field_2._8_8_ + 1) {
                pvVar10 = std::
                          vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::
                          operator[](this_01,memberName.field_2._8_8_);
                iVar5 = (*pvVar10->type->_vptr_TType[6])();
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)local_2f0,
                             (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                              *)CONCAT44(extraout_var,iVar5));
                local_2f8._M_node =
                     (_Base_ptr)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                     ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                             *)&usedUniformLocation.
                                super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                            (key_type *)local_2f0);
                err_2.field_2._8_8_ =
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                     ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                            *)&usedUniformLocation.
                               super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
                bVar4 = std::operator!=(&local_2f8,(_Self *)((long)&err_2.field_2 + 8));
                if (bVar4) {
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                          *)&usedUniformLocation.
                                             super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (key_type *)local_2f0);
                  plVar12 = (long *)(**(code **)(*(long *)uniformVar.second.id + 0xf0))();
                  pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)(**(code **)(*plVar12 + 0x28))();
                  bVar4 = std::operator!=(pmVar13,pbVar7);
                  if (!bVar4) goto LAB_00712665;
                  std::operator+((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)local_328,"Invalid block member name: ",
                                 (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                  *)local_2f0);
                  pTVar1 = this->infoSink;
                  pcVar11 = std::__cxx11::
                            basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            ::c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                     *)local_328);
                  TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar11);
                  *hadError = true;
                  err_1.field_2._12_4_ = 7;
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                 *)local_328);
                }
                else {
                  plVar12 = (long *)(**(code **)(*(long *)uniformVar.second.id + 0xf0))();
                  pbVar7 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                            *)(**(code **)(*plVar12 + 0x28))();
                  pmVar13 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                                          *)&usedUniformLocation.
                                             super__Vector_base<glslang::TRange,_std::allocator<glslang::TRange>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                         (key_type *)local_2f0);
                  std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  operator=(pmVar13,pbVar7);
LAB_00712665:
                  err_1.field_2._12_4_ = 0;
                }
                std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                               *)local_2f0);
                if (err_1.field_2._12_4_ != 0) break;
              }
            }
          }
          if ((*hadError & 1U) == 0) {
            err_1.field_2._12_4_ = 0;
          }
          else {
            err_1.field_2._12_4_ = 5;
          }
        }
        else {
          pTVar8 = (TType *)(**(code **)(*(long *)lVar3 + 0xf0))();
          locationRange.start = TIntermediate::computeTypeUniformLocationSize(pTVar8);
          TRange::TRange((TRange *)&stack0xfffffffffffffe60,locationRange.last,
                         locationRange.last + locationRange.start + -1);
          local_1a4 = 0xffffffff;
          local_1a5 = false;
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )((long)&err.field_2 + 8),
                       (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *
                       )&size);
          local_1a4 = checkLocationOverlap
                                (this,(TRange *)&stack0xfffffffffffffe60,
                                 (vector<glslang::TRange,_std::allocator<glslang::TRange>_> *)
                                 &usedUniformName.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (TString *)((long)&err.field_2 + 8),
                                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                                  *)local_98,&local_1a5);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)((long)&err.field_2 + 8));
          if (local_1a4 == -1) {
            std::vector<glslang::TRange,_std::allocator<glslang::TRange>_>::push_back
                      ((vector<glslang::TRange,_std::allocator<glslang::TRange>_> *)
                       &usedUniformName.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                       (value_type *)&stack0xfffffffffffffe60);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
            ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                         *)local_98,(value_type *)&size);
            goto LAB_00712472;
          }
          if (local_1a4 < 0) goto LAB_00712472;
          if ((local_1a5 & 1U) == 1) {
            std::__cxx11::to_string(&local_238,local_1a4);
            std::operator+(&local_218,"Uniform location should be equal for same uniforms: ",
                           &local_238);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            pool_allocator<char>::pool_allocator(&local_240);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       local_1f8,pcVar11,&local_240);
            std::__cxx11::string::~string((string *)&local_218);
            std::__cxx11::string::~string((string *)&local_238);
            pTVar1 = this->infoSink;
            pcVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_1f8);
            TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar11);
            *hadError = true;
            err_1.field_2._12_4_ = 5;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_1f8);
          }
          else {
            std::__cxx11::to_string(&local_2b0,local_1a4);
            std::operator+(&local_290,"Uniform location overlaps across stages: ",&local_2b0);
            pcVar11 = (char *)std::__cxx11::string::c_str();
            pool_allocator<char>::pool_allocator((pool_allocator<char> *)&blockType);
            std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
            basic_string<glslang::std::allocator<char>>
                      ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                       local_270,pcVar11,(pool_allocator<char> *)&blockType);
            std::__cxx11::string::~string((string *)&local_290);
            std::__cxx11::string::~string((string *)&local_2b0);
            pTVar1 = this->infoSink;
            pcVar11 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      c_str((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_270);
            TInfoSinkBase::message(&pTVar1->info,EPrefixInternalError,pcVar11);
            *hadError = true;
            err_1.field_2._12_4_ = 5;
            std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                             *)local_270);
          }
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                      &size);
        if (err_1.field_2._12_4_ == 0) {
          err_1.field_2._12_4_ = 0;
        }
        std::
        pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
        ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>
                 *)&pSymbol);
        if (err_1.field_2._12_4_ != 0) break;
        std::
        _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TVarEntryInfo>_>
        ::operator++(&__end4);
      }
    }
    __range4._4_4_ = __range4._4_4_ + 1;
  } while( true );
}

Assistant:

TSymbolValidater(TIoMapResolver& r, TInfoSink& i, TVarLiveMap* in[EShLangCount], TVarLiveMap* out[EShLangCount],
                     TVarLiveMap* uniform[EShLangCount], bool& hadError, EProfile profile, int version)
        : resolver(r)
        , infoSink(i)
        , hadError(hadError)
        , profile(profile)
        , version(version)
    {
        memcpy(inVarMaps, in, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(outVarMaps, out, EShLangCount * (sizeof(TVarLiveMap*)));
        memcpy(uniformVarMap, uniform, EShLangCount * (sizeof(TVarLiveMap*)));

        std::map<TString, TString> anonymousMemberMap;
        std::vector<TRange> usedUniformLocation;
        std::vector<TString> usedUniformName;
        usedUniformLocation.clear();
        usedUniformName.clear();
        for (int i = 0; i < EShLangCount; i++) {
            if (uniformVarMap[i]) {
                for (auto uniformVar : *uniformVarMap[i])
                {
                    TIntermSymbol* pSymbol = uniformVar.second.symbol;
                    TQualifier qualifier = uniformVar.second.symbol->getQualifier();
                    TString symbolName = pSymbol->getAccessName();

                    // All the uniform needs multi-stage location check (block/default)
                    int uniformLocation = qualifier.layoutLocation;

                    if (uniformLocation != TQualifier::layoutLocationEnd) {
                        // Total size of current uniform, could be block, struct or other types.
                        int size = TIntermediate::computeTypeUniformLocationSize(pSymbol->getType());

                        TRange locationRange(uniformLocation, uniformLocation + size - 1);

                        // Combine location and component ranges
                        int overlapLocation = -1;
                        bool diffLocation = false;

                        // Check for collisions, except for vertex inputs on desktop targeting OpenGL
                        overlapLocation = checkLocationOverlap(locationRange, usedUniformLocation, symbolName, usedUniformName, diffLocation);

                        // Overlap locations of uniforms, regardless of components (multi stages)
                        if (overlapLocation == -1) {
                            usedUniformLocation.push_back(locationRange);
                            usedUniformName.push_back(symbolName);
                        }
                        else if (overlapLocation >= 0) {
                            if (diffLocation == true) {
                                TString err = ("Uniform location should be equal for same uniforms: " +std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                            else {
                                TString err = ("Uniform location overlaps across stages: " + std::to_string(overlapLocation)).c_str();
                                infoSink.info.message(EPrefixInternalError, err.c_str());
                                hadError = true;
                                break;
                            }
                        }
                    }

                    if ((uniformVar.second.symbol->getBasicType() == EbtBlock) &&
                        IsAnonymous(uniformVar.second.symbol->getName()))
                    {
                        auto blockType = uniformVar.second.symbol->getType().getStruct();
                        for (size_t memberIdx = 0; memberIdx < blockType->size(); ++memberIdx) {
                            auto memberName = (*blockType)[memberIdx].type->getFieldName();
                            if (anonymousMemberMap.find(memberName) != anonymousMemberMap.end())
                            {
                                if (anonymousMemberMap[memberName] != uniformVar.second.symbol->getType().getTypeName())
                                {
                                    TString err = "Invalid block member name: " + memberName;
                                    infoSink.info.message(EPrefixInternalError, err.c_str());
                                    hadError = true;
                                    break;
                                }
                            }
                            else
                            {
                                anonymousMemberMap[memberName] = uniformVar.second.symbol->getType().getTypeName();
                            }
                        }
                    }
                    if (hadError)
                        break;
                }
            }
        }
    }